

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.hpp
# Opt level: O1

batch __thiscall
ear::PolarExtentCoreSimd<xsimd::sse4_2>::weight_from_cos
          (PolarExtentCoreSimd<xsimd::sse4_2> *this,PolarExtentCoreContext *ctx,batch cos_angle)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  float fVar15;
  undefined4 in_EAX;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  float fVar26;
  float fVar27;
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  undefined8 uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar37;
  float fVar39;
  undefined1 auVar33 [16];
  float fVar41;
  undefined1 auVar34 [16];
  float fVar38;
  float fVar40;
  float fVar42;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  batch bVar47;
  
  fVar26 = cos_angle.super_simd_register<float,_xsimd::sse4_2>.
           super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
           super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[0];
  fVar27 = cos_angle.super_simd_register<float,_xsimd::sse4_2>.
           super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
           super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data[1];
  fVar13 = ctx->cos_start_angle;
  iVar17 = -(uint)(fVar26 < fVar13);
  iVar19 = -(uint)(fVar27 < fVar13);
  auVar30._4_4_ = iVar19;
  auVar30._0_4_ = iVar17;
  auVar30._8_4_ = -(uint)(in_XMM0_Dc < fVar13);
  auVar30._12_4_ = -(uint)(in_XMM0_Dd < fVar13);
  iVar16 = movmskps(in_EAX,auVar30);
  if (iVar16 == 0) {
    uVar28 = 0x3f8000003f800000;
  }
  else {
    fVar14 = ctx->cos_end_angle;
    auVar46._4_4_ = -(uint)(fVar14 < fVar27);
    auVar46._0_4_ = -(uint)(fVar14 < fVar26);
    auVar46._8_4_ = -(uint)(fVar14 < in_XMM0_Dc);
    auVar46._12_4_ = -(uint)(fVar14 < in_XMM0_Dd);
    iVar16 = movmskps(iVar16,auVar46);
    if (iVar16 == 0) {
      uVar28 = 0;
    }
    else {
      iVar16 = -(uint)(0.5 < ABS(fVar26));
      iVar20 = -(uint)(0.5 < ABS(fVar27));
      iVar22 = -(uint)(0.5 < ABS(in_XMM0_Dc));
      iVar24 = -(uint)(0.5 < ABS(in_XMM0_Dd));
      auVar29._0_4_ = 0.5 - ABS(fVar26) * 0.5;
      auVar29._4_4_ = 0.5 - ABS(fVar27) * 0.5;
      auVar29._8_4_ = 0.5 - ABS(in_XMM0_Dc) * 0.5;
      auVar29._12_4_ = 0.5 - ABS(in_XMM0_Dd) * 0.5;
      auVar30 = sqrtps(auVar29,auVar29);
      auVar33._0_8_ =
           cos_angle.super_simd_register<float,_xsimd::sse4_2>.
           super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
           super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data.
           _0_8_;
      auVar33._8_4_ = in_XMM0_Dc;
      auVar33._12_4_ = in_XMM0_Dd;
      auVar1._4_4_ = iVar20;
      auVar1._0_4_ = iVar16;
      auVar1._8_4_ = iVar22;
      auVar1._12_4_ = iVar24;
      auVar30 = blendvps(auVar33,auVar30,auVar1);
      fVar31 = auVar30._0_4_;
      fVar37 = auVar30._4_4_;
      auVar43._0_8_ = auVar30._0_8_ & 0x7fffffff7fffffff;
      fVar39 = auVar30._8_4_;
      auVar43._8_4_ = ABS(fVar39);
      fVar41 = auVar30._12_4_;
      auVar43._12_4_ = ABS(fVar41);
      auVar45._0_4_ = ((float)DAT_001cd180 - ABS(fVar31)) * 0.5;
      auVar45._4_4_ = (DAT_001cd180._4_4_ - ABS(fVar37)) * 0.5;
      auVar45._8_4_ = (DAT_001cd180._8_4_ - auVar43._8_4_) * 0.5;
      auVar45._12_4_ = (DAT_001cd180._12_4_ - auVar43._12_4_) * 0.5;
      iVar18 = -(uint)(0.5 < ABS(fVar31));
      iVar21 = -(uint)(0.5 < ABS(fVar37));
      iVar23 = -(uint)(0.5 < auVar43._8_4_);
      iVar25 = -(uint)(0.5 < auVar43._12_4_);
      auVar34._0_4_ = fVar31 * fVar31;
      auVar34._4_4_ = fVar37 * fVar37;
      auVar34._8_4_ = fVar39 * fVar39;
      auVar34._12_4_ = fVar41 * fVar41;
      auVar2._4_4_ = iVar21;
      auVar2._0_4_ = iVar18;
      auVar2._8_4_ = iVar23;
      auVar2._12_4_ = iVar25;
      auVar30 = blendvps(auVar34,auVar45,auVar2);
      auVar46 = sqrtps(auVar45,auVar30);
      auVar3._4_4_ = iVar21;
      auVar3._0_4_ = iVar18;
      auVar3._8_4_ = iVar23;
      auVar3._12_4_ = iVar25;
      auVar46 = blendvps(auVar43,auVar46,auVar3);
      fVar32 = auVar30._0_4_;
      fVar38 = auVar30._4_4_;
      fVar40 = auVar30._8_4_;
      fVar42 = auVar30._12_4_;
      fVar15 = ctx->m;
      auVar35._0_4_ =
           fVar32 * auVar46._0_4_ *
           ((((fVar32 * 0.0421632 + 0.024181312) * fVar32 + 0.045470025) * fVar32 + 0.074953005) *
            fVar32 + 0.16666752) + auVar46._0_4_;
      auVar35._4_4_ =
           fVar38 * auVar46._4_4_ *
           ((((fVar38 * 0.0421632 + 0.024181312) * fVar38 + 0.045470025) * fVar38 + 0.074953005) *
            fVar38 + 0.16666752) + auVar46._4_4_;
      auVar35._8_4_ =
           fVar40 * auVar46._8_4_ *
           ((((fVar40 * 0.0421632 + 0.024181312) * fVar40 + 0.045470025) * fVar40 + 0.074953005) *
            fVar40 + 0.16666752) + auVar46._8_4_;
      auVar35._12_4_ =
           fVar42 * auVar46._12_4_ *
           ((((fVar42 * 0.0421632 + 0.024181312) * fVar42 + 0.045470025) * fVar42 + 0.074953005) *
            fVar42 + 0.16666752) + auVar46._12_4_;
      auVar4._4_4_ = iVar21;
      auVar4._0_4_ = iVar18;
      auVar4._8_4_ = iVar23;
      auVar4._12_4_ = iVar25;
      auVar12._4_4_ = 1.5707964 - (auVar35._4_4_ + auVar35._4_4_);
      auVar12._0_4_ = 1.5707964 - (auVar35._0_4_ + auVar35._0_4_);
      auVar12._8_4_ = 1.5707964 - (auVar35._8_4_ + auVar35._8_4_);
      auVar12._12_4_ = 1.5707964 - (auVar35._12_4_ + auVar35._12_4_);
      auVar30 = blendvps(auVar35,auVar12,auVar4);
      auVar36._0_4_ = (float)(auVar30._0_4_ ^ (uint)fVar31 & 0x80000000);
      auVar36._4_4_ = (float)(auVar30._4_4_ ^ (uint)fVar37 & 0x80000000);
      auVar36._8_4_ = (float)(auVar30._8_4_ ^ (uint)fVar39 & 0x80000000);
      auVar36._12_4_ = (float)(auVar30._12_4_ ^ (uint)fVar41 & 0x80000000);
      auVar5._4_4_ = iVar20;
      auVar5._0_4_ = iVar16;
      auVar5._8_4_ = iVar22;
      auVar5._12_4_ = iVar24;
      auVar9._4_4_ = auVar36._4_4_ + auVar36._4_4_;
      auVar9._0_4_ = auVar36._0_4_ + auVar36._0_4_;
      auVar9._8_4_ = auVar36._8_4_ + auVar36._8_4_;
      auVar9._12_4_ = auVar36._12_4_ + auVar36._12_4_;
      auVar30 = blendvps(auVar36,auVar9,auVar5);
      auVar6._4_4_ = -(uint)(fVar27 < -0.5);
      auVar6._0_4_ = -(uint)(fVar26 < -0.5);
      auVar6._8_4_ = -(uint)(in_XMM0_Dc < -0.5);
      auVar6._12_4_ = -(uint)(in_XMM0_Dd < -0.5);
      auVar10._4_4_ = 3.1415927 - auVar30._4_4_;
      auVar10._0_4_ = 3.1415927 - auVar30._0_4_;
      auVar10._8_4_ = 3.1415927 - auVar30._8_4_;
      auVar10._12_4_ = 3.1415927 - auVar30._12_4_;
      auVar30 = blendvps(auVar30,auVar10,auVar6);
      auVar44._0_4_ = 1.5707964 - auVar30._0_4_;
      auVar44._4_4_ = 1.5707964 - auVar30._4_4_;
      auVar44._8_4_ = 1.5707964 - auVar30._8_4_;
      auVar44._12_4_ = 1.5707964 - auVar30._12_4_;
      auVar7._4_4_ = iVar20;
      auVar7._0_4_ = iVar16;
      auVar7._8_4_ = iVar22;
      auVar7._12_4_ = iVar24;
      auVar30 = blendvps(auVar44,auVar30,auVar7);
      fVar31 = ctx->c;
      auVar8._4_4_ = iVar19;
      auVar8._0_4_ = iVar17;
      auVar8._8_4_ = -(uint)(in_XMM0_Dc < fVar13);
      auVar8._12_4_ = -(uint)(in_XMM0_Dd < fVar13);
      auVar11._4_4_ = -(uint)(fVar14 < fVar27) & (uint)(fVar31 + auVar30._4_4_ * fVar15);
      auVar11._0_4_ = -(uint)(fVar14 < fVar26) & (uint)(fVar31 + auVar30._0_4_ * fVar15);
      auVar11._8_4_ = -(uint)(fVar14 < in_XMM0_Dc) & (uint)(fVar31 + auVar30._8_4_ * fVar15);
      auVar11._12_4_ = -(uint)(fVar14 < in_XMM0_Dd) & (uint)(fVar31 + auVar30._12_4_ * fVar15);
      auVar30 = blendvps(_DAT_001cd180,auVar11,auVar8);
      uVar28 = auVar30._0_8_;
    }
  }
  bVar47.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[3] = (float)iVar19;
  bVar47.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[2] = (float)iVar17;
  bVar47.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[0] = (float)(int)uVar28;
  bVar47.super_simd_register<float,_xsimd::sse4_2>.super_simd_register<float,_xsimd::sse4_1>.
  super_simd_register<float,_xsimd::ssse3>.super_simd_register<float,_xsimd::sse3>.
  super_simd_register<float,_xsimd::sse2>.data[1] = (float)(int)((ulong)uVar28 >> 0x20);
  return (batch)bVar47.super_simd_register<float,_xsimd::sse4_2>.
                super_simd_register<float,_xsimd::sse4_1>.super_simd_register<float,_xsimd::ssse3>.
                super_simd_register<float,_xsimd::sse3>.super_simd_register<float,_xsimd::sse2>.data
  ;
}

Assistant:

batch weight_from_cos(PolarExtentCoreContext &ctx, batch cos_angle) const {
      auto start = cos_angle >= ctx.cos_start_angle;
      auto end = cos_angle <= ctx.cos_end_angle;
      if (xsimd::all(start)) return batch{1.0};
      if (xsimd::all(end)) return batch{0.0};

      auto ramp = ctx.m * xsimd::acos(cos_angle) + ctx.c;
      return xsimd::select(start, batch{1.0},
                           xsimd::select(end, batch{0.0}, ramp));
    }